

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::checkCandidate
          (ClauseMatcher *this,Clause *cl,int *resolvedQueryLit)

{
  LitInfo *pLVar1;
  LiteralMatcher *this_00;
  bool bVar2;
  int iVar3;
  MatchInfo **ppMVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar8 = *(uint *)&cl->field_0x38 & 0xfffff;
  if (uVar8 < 2) {
    *resolvedQueryLit = -1;
    if (((uVar8 == 1) && (this->sres != false)) &&
       (uVar5 = (ulong)*(uint *)((**(ulong **)
                                    &((((this->lms)._stack)->_self)._M_t.
                                      super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                      .
                                      super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                                     ._M_head_impl)->super_Matcher >> 3) + 0x34), uVar5 != 0)) {
      uVar9 = 0;
      do {
        ppMVar4 = CodeTree::ILStruct::getMatch
                            ((ILStruct *)
                             (**(ulong **)
                                &((((this->lms)._stack)->_self)._M_t.
                                  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                  .
                                  super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                                 ._M_head_impl)->super_Matcher >> 3),(uint)uVar9);
        pLVar1 = (this->lInfos)._array;
        if (pLVar1[*(uint *)*ppMVar4].opposite != true) {
          *resolvedQueryLit = -1;
          return true;
        }
        *resolvedQueryLit = pLVar1[*(uint *)*ppMVar4].litIndex;
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    return true;
  }
  lVar10 = (ulong)(uVar8 - 1) << 4;
  lVar6 = (ulong)(uVar8 - 1) + 1;
  do {
    this_00 = *(LiteralMatcher **)
               ((long)&(((this->lms)._stack)->_self)._M_t.
                       super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                       .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
                       _M_head_impl + lVar10);
    iVar3 = 5;
    if (this_00->_eagerlyMatched == false) {
      if (*(int *)((((this_00->super_Matcher).super_BaseMatcher.op)->_content >> 3) + 0x10) == 0) {
        iVar3 = 7;
      }
      else {
        LiteralMatcher::doEagerMatching(this_00);
        iVar3 = 0;
      }
    }
    if ((iVar3 != 7) && (iVar3 != 0)) break;
    lVar10 = lVar10 + -0x10;
    lVar7 = lVar6 + -1;
    bVar2 = 0 < lVar6;
    lVar6 = lVar7;
  } while (lVar7 != 0 && bVar2);
  bVar2 = matchGlobalVars(this,resolvedQueryLit);
  return bVar2;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::checkCandidate(Clause* cl, int& resolvedQueryLit)
{
  unsigned clen=cl->length();
  //the last matcher in mls is the one that yielded the SUCCESS operation
  ASS_EQ(clen, lms.size()-1);
  ASS_EQ(clen, lms[clen-1]->op->getILS()->depth+1);

  if(clen<=1) {
    //if clause doesn't have multiple literals, there is no need
    //for multi-literal matching
    resolvedQueryLit=-1;
    if(sres && clen==1) {
      size_t matchCnt=lms[0]->getILS()->matchCnt;
      for(size_t i=0;i<matchCnt;i++) {
	MatchInfo* mi=lms[0]->getILS()->getMatch(i);
	if(lInfos[mi->liIndex].opposite) {
	  resolvedQueryLit=lInfos[mi->liIndex].litIndex;
	}
	else {
	  //we prefer subsumption to subsumption resolution
	  resolvedQueryLit=-1;
	  break;
	}
      }
    }
    return true;
  }

//  if(matchGlobalVars(resolvedQueryLit)) {
//    return true;
//  }

  bool newMatches=false;
  for(int i=clen-1;i>=0;i--) {
    LiteralMatcher* lm = &*lms[i];
    if(lm->eagerlyMatched()) {
      break;
    }
    if(lm->getILS()->varCnt==0) {
      //If the index term is ground, at most two literals can be matched on
      //it (the second one is the opposite one in case we're performing the
      //subsumption resolution) We are here, so we have matched one already,
      //and we know that the query clause doesn't contain two equal or opposite
      //literals (or else it would have been simplified by duplicate literal
      //removal or by tautology deletion). Therefore we don't need to try
      //matching the rest of the query clause.
      continue;
    }
    newMatches|=lm->doEagerMatching();
  }
  (void)newMatches; // to prevent a warning
  return matchGlobalVars(resolvedQueryLit);
//  return newMatches && matchGlobalVars(resolvedQueryLit);
}